

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::GetNode
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  Node *pNVar1;
  FString local_30;
  FString local_28;
  
  FString::AttachToOther(&local_28,key);
  pNVar1 = FindKey(this,&local_28);
  FString::~FString(&local_28);
  if (pNVar1 == (Node *)0x0) {
    FString::AttachToOther(&local_30,key);
    pNVar1 = NewKey(this,&local_30);
    FString::~FString(&local_30);
    (pNVar1->Pair).Value.Count = 0;
  }
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}